

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O3

tuple<int,_int>
check_paths_and_choose_tuple
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *mtrx)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  iterator __beg_1;
  pointer pdVar3;
  pointer pvVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  iterator __beg;
  pointer pvVar7;
  iterator iVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  double *pdVar12;
  double *pdVar13;
  pointer pdVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  vector<double,_std::allocator<double>_> vec2;
  vector<double,_std::allocator<double>_> vec1;
  pair<int,_int> pair;
  map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  tmp;
  double *local_f8;
  iterator iStack_f0;
  double *local_e8;
  double *local_d8;
  iterator iStack_d0;
  double *local_c8;
  _Base_ptr local_b8;
  ulong local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  _Tuple_impl<0UL,_int,_int> local_98;
  ulong local_90;
  double local_88;
  key_type local_80;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_c8 = (double *)0x0;
  local_d8 = (double *)0x0;
  iStack_d0._M_current = (double *)0x0;
  local_e8 = (double *)0x0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_f8 = (double *)0x0;
  iStack_f0._M_current = (double *)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  (mtrx->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pvVar4 = (in_RSI->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (in_RSI->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pvVar7 != pvVar4) {
    iVar8._M_current = (double *)0x0;
    pdVar13 = (double *)0x0;
    pdVar9 = (double *)0x0;
    uVar15 = 0;
    local_98 = (_Tuple_impl<0UL,_int,_int>)mtrx;
    do {
      pdVar3 = pvVar4[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar14 = pvVar4[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_b0 = uVar15 + 1;
      local_90 = uVar15;
      if (pdVar14 != pdVar3) {
        uVar17 = 0;
        do {
          if ((pdVar3[uVar17] == 0.0) && (!NAN(pdVar3[uVar17]))) {
            if (pdVar14 != pdVar3) {
              lVar16 = 0;
              uVar11 = 0;
              do {
                if (iStack_d0._M_current == local_c8) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&local_d8,iStack_d0,
                             (double *)((long)pdVar3 + lVar16));
                  pvVar4 = (in_RSI->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  *iStack_d0._M_current = *(double *)((long)pdVar3 + lVar16);
                  iStack_d0._M_current = iStack_d0._M_current + 1;
                }
                uVar11 = uVar11 + 1;
                pdVar3 = pvVar4[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar16 = lVar16 + 8;
                pdVar9 = local_d8;
                iVar8._M_current = iStack_d0._M_current;
              } while (uVar11 < (ulong)((long)pvVar4[uVar15].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pdVar3 >> 3));
            }
            pdVar13 = pdVar9 + uVar17 + 1;
            if (pdVar13 != iVar8._M_current) {
              memmove(pdVar9 + uVar17,pdVar13,(long)iVar8._M_current - (long)pdVar13);
              pdVar9 = local_d8;
              iVar8._M_current = iStack_d0._M_current;
            }
            iStack_d0._M_current = iVar8._M_current + -1;
            uVar11 = (long)iStack_d0._M_current - (long)pdVar9;
            pdVar13 = pdVar9;
            if (0 < (long)uVar11 >> 5) {
              pdVar12 = (double *)((uVar11 & 0xffffffffffffffe0) + (long)pdVar9);
              lVar16 = ((long)uVar11 >> 5) + 1;
              pdVar13 = pdVar9 + 2;
              do {
                if (NAN(pdVar13[-2])) {
                  pdVar13 = pdVar13 + -2;
                  goto LAB_00102c5b;
                }
                if (NAN(pdVar13[-1])) {
                  pdVar13 = pdVar13 + -1;
                  goto LAB_00102c5b;
                }
                if (NAN(*pdVar13)) goto LAB_00102c5b;
                if (NAN(pdVar13[1])) {
                  pdVar13 = pdVar13 + 1;
                  goto LAB_00102c5b;
                }
                lVar16 = lVar16 + -1;
                pdVar13 = pdVar13 + 4;
              } while (1 < lVar16);
              uVar11 = (long)iStack_d0._M_current - (long)pdVar12;
              pdVar13 = pdVar12;
            }
            lVar16 = (long)uVar11 >> 3;
            if (lVar16 == 1) {
LAB_00102c3c:
              if (NAN(*pdVar13)) goto LAB_00102c5b;
            }
            else {
              if (lVar16 == 2) {
LAB_00102c2a:
                if (!NAN(*pdVar13)) {
                  pdVar13 = pdVar13 + 1;
                  goto LAB_00102c3c;
                }
              }
              else {
                if (lVar16 != 3) goto LAB_00102c8e;
                if (!NAN(*pdVar13)) {
                  pdVar13 = pdVar13 + 1;
                  goto LAB_00102c2a;
                }
              }
LAB_00102c5b:
              pdVar12 = pdVar13;
              if (pdVar13 != iStack_d0._M_current) {
                while (pdVar12 = pdVar12 + 1, pdVar12 != iStack_d0._M_current) {
                  if (!NAN(*pdVar12)) {
                    *pdVar13 = *pdVar12;
                    pdVar13 = pdVar13 + 1;
                  }
                }
              }
              if (pdVar13 != iStack_d0._M_current) {
                iStack_d0._M_current = pdVar13;
              }
            }
LAB_00102c8e:
            if ((pdVar9 != iStack_d0._M_current) &&
               (pdVar13 = pdVar9 + 1, pdVar13 != iStack_d0._M_current)) {
              dVar18 = *pdVar9;
              do {
                dVar2 = *pdVar13;
                pdVar12 = pdVar13;
                if (dVar18 <= *pdVar13) {
                  dVar2 = dVar18;
                  pdVar12 = pdVar9;
                }
                pdVar9 = pdVar12;
                dVar18 = dVar2;
                pdVar13 = pdVar13 + 1;
              } while (pdVar13 != iStack_d0._M_current);
            }
            local_b8 = (_Base_ptr)*pdVar9;
            pvVar4 = (in_RSI->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pvVar7 = (in_RSI->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            if (pvVar7 != pvVar4) {
              lVar16 = 0;
              uVar11 = 0;
              do {
                pdVar9 = (double *)
                         (uVar17 * 8 +
                         *(long *)((long)&(pvVar4->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar16));
                if (iStack_f0._M_current == local_e8) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&local_f8,iStack_f0,pdVar9);
                  pvVar4 = (in_RSI->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  pvVar7 = (in_RSI->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  *iStack_f0._M_current = *pdVar9;
                  iStack_f0._M_current = iStack_f0._M_current + 1;
                }
                uVar11 = uVar11 + 1;
                uVar10 = ((long)pvVar7 - (long)pvVar4 >> 3) * -0x5555555555555555;
                lVar16 = lVar16 + 0x18;
              } while (uVar11 <= uVar10 && uVar10 - uVar11 != 0);
            }
            pdVar9 = local_f8 + local_90 + 1;
            if (pdVar9 != iStack_f0._M_current) {
              memmove(local_f8 + local_90,pdVar9,(long)iStack_f0._M_current - (long)pdVar9);
            }
            iStack_f0._M_current = iStack_f0._M_current + -1;
            uVar11 = (long)iStack_f0._M_current - (long)local_f8;
            pdVar9 = local_f8;
            if (0 < (long)uVar11 >> 5) {
              pdVar13 = (double *)((uVar11 & 0xffffffffffffffe0) + (long)local_f8);
              lVar16 = ((long)uVar11 >> 5) + 1;
              pdVar9 = local_f8 + 2;
              do {
                if (NAN(pdVar9[-2])) {
                  pdVar9 = pdVar9 + -2;
                  goto LAB_00102e28;
                }
                if (NAN(pdVar9[-1])) {
                  pdVar9 = pdVar9 + -1;
                  goto LAB_00102e28;
                }
                if (NAN(*pdVar9)) goto LAB_00102e28;
                if (NAN(pdVar9[1])) {
                  pdVar9 = pdVar9 + 1;
                  goto LAB_00102e28;
                }
                lVar16 = lVar16 + -1;
                pdVar9 = pdVar9 + 4;
              } while (1 < lVar16);
              uVar11 = (long)iStack_f0._M_current - (long)pdVar13;
              pdVar9 = pdVar13;
            }
            lVar16 = (long)uVar11 >> 3;
            if (lVar16 == 1) {
LAB_00102e09:
              if (NAN(*pdVar9)) goto LAB_00102e28;
            }
            else {
              if (lVar16 == 2) {
LAB_00102df7:
                if (!NAN(*pdVar9)) {
                  pdVar9 = pdVar9 + 1;
                  goto LAB_00102e09;
                }
              }
              else {
                if (lVar16 != 3) goto LAB_00102e62;
                if (!NAN(*pdVar9)) {
                  pdVar9 = pdVar9 + 1;
                  goto LAB_00102df7;
                }
              }
LAB_00102e28:
              pdVar13 = pdVar9;
              if (pdVar9 != iStack_f0._M_current) {
                while (pdVar13 = pdVar13 + 1, pdVar13 != iStack_f0._M_current) {
                  if (!NAN(*pdVar13)) {
                    *pdVar9 = *pdVar13;
                    pdVar9 = pdVar9 + 1;
                  }
                }
              }
              if (pdVar9 != iStack_f0._M_current) {
                iStack_f0._M_current = pdVar9;
              }
            }
LAB_00102e62:
            pdVar9 = local_f8 + 1;
            pdVar13 = local_f8;
            if (pdVar9 != iStack_f0._M_current && local_f8 != iStack_f0._M_current) {
              dVar18 = *local_f8;
              do {
                dVar2 = *pdVar9;
                pdVar12 = pdVar9;
                if (dVar18 <= *pdVar9) {
                  dVar2 = dVar18;
                  pdVar12 = pdVar13;
                }
                pdVar13 = pdVar12;
                dVar18 = dVar2;
                pdVar9 = pdVar9 + 1;
              } while (pdVar9 != iStack_f0._M_current);
            }
            local_88 = *pdVar13;
            local_80 = (key_type)((uVar17 << 0x20) + local_b0 + 0x100000000);
            pmVar5 = std::
                     map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                     ::operator[]((map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                                   *)&local_78,&local_80);
            *pmVar5 = (double)local_b8 + local_88;
            iVar8._M_current = iStack_d0._M_current;
            pdVar13 = local_d8;
          }
          pdVar9 = pdVar13;
          if (iVar8._M_current != pdVar9) {
            iVar8._M_current = pdVar9;
            iStack_d0._M_current = pdVar9;
          }
          if (iStack_f0._M_current != local_f8) {
            iStack_f0._M_current = local_f8;
          }
          uVar17 = uVar17 + 1;
          pvVar4 = (in_RSI->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pdVar3 = pvVar4[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar14 = pvVar4[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pdVar13 = pdVar9;
        } while (uVar17 < (ulong)((long)pdVar14 - (long)pdVar3 >> 3));
        pvVar7 = (in_RSI->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      mtrx = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_98;
      uVar17 = ((long)pvVar7 - (long)pvVar4 >> 3) * -0x5555555555555555;
      uVar15 = local_b0;
    } while (local_b0 <= uVar17 && uVar17 - local_b0 != 0);
    p_Var1 = &local_78._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_78._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = (_Base_ptr)0x0;
      p_Var6 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if ((double)local_b8 < (double)p_Var6[1]._M_parent) {
          local_a8 = CONCAT44((int)*(undefined8 *)(p_Var6 + 1),
                              (int)((ulong)*(undefined8 *)(p_Var6 + 1) >> 0x20));
          uStack_a0 = 0;
          local_b8 = p_Var6[1]._M_parent;
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
  }
  *(undefined8 *)mtrx = local_a8;
  reduce_rows_cols(&local_48,in_RSI,(tuple<int,_int> *)mtrx);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~_Rb_tree(&local_78);
  if (local_f8 != (double *)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_d8 != (double *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)mtrx;
}

Assistant:

std::tuple<int,int> check_paths_and_choose_tuple(std::vector<std::vector<double>> &mtrx){

    std::vector<double> vec1,vec2;
    std::map<std::pair<int,int>,double> tmp;
    std::vector<std::tuple<int,int>> path;
    std::tuple<int,int> pas;

    double buff1,buff2;
    for (int i=0; i<mtrx.size();i++){
        for(int j=0; j<mtrx[i].size();j++) {
            if (mtrx[i][j] == 0) {
                for (int k = 0; k < mtrx[i].size(); k++) {
                    vec1.push_back(mtrx[i][k]);
                }
                vec1.erase(vec1.begin() + j);
                vec1.erase(std::remove_if(std::begin(vec1),std::end(vec1), [](const auto& value) {return std::isnan(value);}),std::end(vec1));
                buff1 = *std::min_element(vec1.begin(),vec1.end());
                for(int l =0; l<mtrx.size(); l++){
                    vec2.push_back(mtrx[l][j]);
                }
                vec2.erase(vec2.begin()+ i);
                vec2.erase(std::remove_if(std::begin(vec2),std::end(vec2), [](const auto& value) {return std::isnan(value);}),std::end(vec2));
                buff2 = *std::min_element(vec2.begin(),vec2.end());
                auto pair = std::make_pair(i+1,j+1);
                tmp[pair] = buff1+buff2;
            }
            vec1.clear();
            vec2.clear();
        }
    }


    pas = findMaxValue_in_map(tmp);
    reduce_rows_cols(mtrx,pas);


    return pas;
}